

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTRefCount.cpp
# Opt level: O3

ASTRef * antlr::ASTRef::getRef(AST *p)

{
  ASTRef *pAVar1;
  
  if (p != (AST *)0x0) {
    pAVar1 = p->ref;
    if (pAVar1 == (ASTRef *)0x0) {
      pAVar1 = (ASTRef *)operator_new(0x10);
      pAVar1->ptr = p;
      pAVar1->count = 1;
      p->ref = pAVar1;
    }
    else {
      pAVar1->count = pAVar1->count + 1;
    }
    return pAVar1;
  }
  return (ASTRef *)0x0;
}

Assistant:

ASTRef* ASTRef::getRef(const AST* p)
{
	if (p) {
		AST* pp = const_cast<AST*>(p);
		if (pp->ref)
			return pp->ref->increment();
		else
			return new ASTRef(pp);
	} else
		return 0;
}